

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

vec3 djb::ggx::d2_to_h2(vec2 *d,float_t zi,float_t z_i)

{
  undefined8 uVar1;
  float_t y_00;
  float_t fVar2;
  float z_00;
  double dVar3;
  vec3 vVar4;
  undefined8 local_f0;
  float_t local_e8;
  vec3 local_e0;
  vec3 local_d0;
  vec3 local_c0;
  vec3 local_b0;
  vec3 local_a0;
  vec3 local_90;
  vec3 local_80;
  vec3 local_70;
  undefined8 local_60;
  vec3 wm;
  undefined1 local_4c [4];
  float_t tmp;
  vec3 x;
  vec3 y;
  vec3 z;
  float_t z_i_local;
  float_t zi_local;
  vec2 *d_local;
  undefined4 uStack_10;
  float_t local_c;
  
  vec3::vec3((vec3 *)&y.y,z_i,0.0,zi);
  vec3::vec3((vec3 *)&x.y,0.0,1.0,0.0);
  vec3::vec3((vec3 *)local_4c,zi,0.0,-z_i);
  fVar2 = dot(d,d);
  wm.y = 1.0 - fVar2;
  wm.z = sat<float>(&wm.y);
  vVar4 = djb::operator*((vec3 *)local_4c,d->x);
  local_90.z = vVar4.z;
  local_80.z = local_90.z;
  local_90._0_8_ = vVar4._0_8_;
  local_80.x = local_90.x;
  local_80.y = local_90.y;
  local_90 = vVar4;
  vVar4 = djb::operator*((vec3 *)&x.y,d->y);
  local_b0.z = vVar4.z;
  local_a0.z = local_b0.z;
  local_b0._0_8_ = vVar4._0_8_;
  local_a0.x = local_b0.x;
  local_a0.y = local_b0.y;
  local_b0 = vVar4;
  vVar4 = djb::operator+(&local_80,&local_a0);
  local_c0.z = vVar4.z;
  local_70.z = local_c0.z;
  local_c0._0_8_ = vVar4._0_8_;
  local_70.x = local_c0.x;
  local_70.y = local_c0.y;
  local_c0 = vVar4;
  dVar3 = std::sqrt((double)(ulong)(uint)wm.z);
  vVar4 = djb::operator*((vec3 *)&y.y,SUB84(dVar3,0));
  local_e0.z = vVar4.z;
  local_d0.z = local_e0.z;
  local_e0._0_8_ = vVar4._0_8_;
  local_d0.x = local_e0.x;
  local_d0.y = local_e0.y;
  vVar4 = djb::operator+(&local_70,&local_d0);
  local_e8 = vVar4.z;
  wm.x = local_e8;
  local_f0 = vVar4._0_8_;
  local_60 = local_f0;
  uVar1 = local_60;
  local_60._0_4_ = vVar4.x;
  fVar2 = (float_t)local_60;
  local_60._4_4_ = vVar4.y;
  y_00 = local_60._4_4_;
  local_60 = uVar1;
  z_00 = sat<float>(&wm.x);
  vec3::vec3((vec3 *)((long)&d_local + 4),fVar2,y_00,z_00);
  vVar4.z = local_c;
  vVar4.x = (float_t)d_local._4_4_;
  vVar4.y = (float_t)uStack_10;
  return vVar4;
}

Assistant:

vec3 ggx::d2_to_h2(const vec2 &d, float_t zi, float_t z_i)
{
	vec3 z = vec3(z_i, 0, zi);
	vec3 y = vec3(0, 1, 0);
	vec3 x = vec3(zi, 0, -z_i); // cross(z, y)
	float_t tmp = sat(1 - dot(d, d));
	vec3 wm = x * d.x + y * d.y + z * sqrt(tmp);

	return vec3(wm.x, wm.y, sat(wm.z));
}